

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module * ly_ctx_get_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  uint uVar1;
  lys_module **pplVar2;
  LY_ERR *pLVar3;
  uint32_t *idx_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (idx == (uint32_t *)0x0)) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
  }
  else {
    while (*idx < (uint)(ctx->models).used) {
      if (((byte)(ctx->models).list[*idx]->field_0x40 >> 6 & 1) == 0) {
        pplVar2 = (ctx->models).list;
        uVar1 = *idx;
        *idx = uVar1 + 1;
        return pplVar2[uVar1];
      }
      *idx = *idx + 1;
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (!ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}